

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MultiThreadedObjectTest::querySetSharedObjects
          (MultiThreadedObjectTest *this,TestThread *thread,int count)

{
  uint uVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppvVar4;
  pointer ppvVar5;
  pointer ppVar6;
  void *pvVar7;
  Type TVar8;
  deUint32 dVar9;
  void **ppvVar10;
  pointer ppVar11;
  int iVar12;
  EndMessageToken *pEVar13;
  deRandom *rnd;
  ThreadLog *this_00;
  EGLint value;
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  objectTypes;
  Type local_5c;
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  local_58;
  Library *local_38;
  
  local_38 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx)
  ;
  iVar12 = thread->m_id;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_start = (Type *)0x0;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Type *)0x0;
  local_58.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
  TVar8 = this->m_types;
  if ((TVar8 & TYPE_PBUFFER) != 0) {
    local_5c = TYPE_PBUFFER;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>(&local_58,(iterator)0x0,&local_5c)
    ;
    TVar8 = this->m_types;
  }
  if ((TVar8 & TYPE_PIXMAP) != 0) {
    local_5c = TYPE_PIXMAP;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_PIXMAP;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    TVar8 = this->m_types;
  }
  if (((this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((TVar8 & TYPE_WINDOW) != 0)) {
    local_5c = TYPE_WINDOW;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_WINDOW;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    TVar8 = this->m_types;
  }
  if ((TVar8 & TYPE_CONTEXT) != 0) {
    local_5c = TYPE_CONTEXT;
    if (local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::_M_realloc_insert<deqp::egl::MultiThreadedObjectTest::Type>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
    }
    else {
      *local_58.
       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
       ._M_impl.super__Vector_impl_data._M_finish = TYPE_CONTEXT;
      local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (0 < count) {
    rnd = &(&this->m_rnd0)[iVar12 != 0].m_rnd;
    this_00 = &thread->m_log;
    do {
      local_5c = 0;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type*,std::vector<deqp::egl::MultiThreadedObjectTest::Type,std::allocator<deqp::egl::MultiThreadedObjectTest::Type>>>,deqp::egl::MultiThreadedObjectTest::Type*>
                ((Random *)rnd,
                 (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                  )local_58.
                   super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                  )local_58.
                   super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_5c,1);
      if ((int)local_5c < 4) {
        if (local_5c == TYPE_PBUFFER) {
          ppvVar4 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppvVar5 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          dVar9 = deRandom_getUint32(rnd);
          ppvVar10 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (int)((ulong)dVar9 % ((ulong)((long)ppvVar5 - (long)ppvVar4) >> 3 & 0xffffffff)
                          );
LAB_00e1471d:
          pvVar7 = *ppvVar10;
          if (pvVar7 != (void *)0x0) {
            dVar9 = deRandom_getUint32(rnd);
            uVar1 = querySetSharedObjects::queryAttributes[dVar9 % 3];
            (*local_38->_vptr_Library[0x2b])
                      (local_38,(this->super_MultiThreadedTest).m_display,pvVar7,(ulong)uVar1,
                       &local_5c);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," = eglQuerySurface(",0x13);
            std::ostream::_M_insert<void_const*>(this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<void_const*>(this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::operator<<(this_00,uVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::operator<<(this_00,local_5c);
            pEVar13 = (EndMessageToken *)0x1ad4697;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
            ThreadLog::operator<<(this_00,pEVar13);
            dVar9 = (*local_38->_vptr_Library[0x1f])();
            eglu::checkError(dVar9,"eglQuerySurface()",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                             ,0x57e);
          }
        }
        else if (local_5c == TYPE_PIXMAP) {
          ppVar2 = (this->m_sharedNativePixmaps).
                   super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = (this->m_sharedNativePixmaps).
                   super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          dVar9 = deRandom_getUint32(rnd);
          iVar12 = (int)((ulong)dVar9 % ((ulong)((long)ppVar3 - (long)ppVar2) >> 4 & 0xffffffff));
          ppVar11 = (pointer)(this->m_sharedNativePixmaps).
                             super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00e14712;
        }
      }
      else {
        if (local_5c == TYPE_WINDOW) {
          ppVar11 = (this->m_sharedNativeWindows).
                    super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar6 = (this->m_sharedNativeWindows).
                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          dVar9 = deRandom_getUint32(rnd);
          iVar12 = (int)((ulong)dVar9 % ((ulong)((long)ppVar6 - (long)ppVar11) >> 4 & 0xffffffff));
          ppVar11 = (this->m_sharedNativeWindows).
                    super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00e14712:
          ppvVar10 = &ppVar11[iVar12].second;
          goto LAB_00e1471d;
        }
        if (local_5c == TYPE_CONTEXT) {
          ppvVar4 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppvVar5 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          dVar9 = deRandom_getUint32(rnd);
          pvVar7 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(int)((ulong)dVar9 % ((ulong)((long)ppvVar5 - (long)ppvVar4) >> 3 & 0xffffffff))
                   ];
          if (pvVar7 != (void *)0x0) {
            dVar9 = deRandom_getUint32(rnd);
            uVar1 = querySetSharedObjects::attributes[dVar9 & 3];
            (*local_38->_vptr_Library[0x29])
                      (local_38,(this->super_MultiThreadedTest).m_display,pvVar7,(ulong)uVar1,
                       &local_5c);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," = eglQueryContext(",0x13);
            std::ostream::_M_insert<void_const*>(this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<void_const*>(this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::operator<<(this_00,uVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::operator<<(this_00,local_5c);
            pEVar13 = (EndMessageToken *)0x1ad4697;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
            ThreadLog::operator<<(this_00,pEVar13);
            dVar9 = (*local_38->_vptr_Library[0x1f])();
            eglu::checkError(dVar9,"eglQueryContext()",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                             ,0x591);
          }
        }
      }
      count = count + -1;
    } while (count != 0);
  }
  if (local_58.
      super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::querySetSharedObjects (TestThread& thread, int count)
{
	const Library&		egl		= getLibrary();
	de::Random&			rnd		= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<Type>		objectTypes;

	if ((m_types & TYPE_PBUFFER) != 0)
		objectTypes.push_back(TYPE_PBUFFER);

	if ((m_types & TYPE_PIXMAP) != 0)
		objectTypes.push_back(TYPE_PIXMAP);

	if (!m_sharedNativeWindows.empty() && (m_types & TYPE_WINDOW) != 0)
		objectTypes.push_back(TYPE_WINDOW);

	if ((m_types & TYPE_CONTEXT) != 0)
		objectTypes.push_back(TYPE_CONTEXT);

	for (int queryNdx = 0; queryNdx < count; queryNdx++)
	{
		const Type	type		= rnd.choose<Type>(objectTypes.begin(), objectTypes.end());
		EGLSurface	surface		= EGL_NO_SURFACE;
		EGLContext	context		= EGL_NO_CONTEXT;

		switch (type)
		{
			case TYPE_PBUFFER:
				surface = m_sharedPbuffers[rnd.getInt(0, (int)(m_sharedPbuffers.size()-1))];
				break;

			case TYPE_PIXMAP:
				surface = m_sharedNativePixmaps[rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1))].second;
				break;

			case TYPE_WINDOW:
				surface = m_sharedNativeWindows[rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1))].second;
				break;

			case TYPE_CONTEXT:
				context = m_sharedContexts[rnd.getInt(0, (int)(m_sharedContexts.size()-1))];
				break;

			default:
				DE_ASSERT(false);
		}

		if (surface != EGL_NO_SURFACE)
		{
			static const EGLint queryAttributes[] =
			{
				EGL_LARGEST_PBUFFER,
				EGL_HEIGHT,
				EGL_WIDTH
			};

			const EGLint	attribute	= queryAttributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(queryAttributes) - 1)];
			EGLBoolean		result;
			EGLint			value;

			result = egl.querySurface(m_display, surface, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQuerySurface(" << m_display << ", " << surface << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQuerySurface()");

		}
		else if (context != EGL_NO_CONTEXT)
		{
			static const EGLint attributes[] =
			{
				EGL_CONFIG_ID,
				EGL_CONTEXT_CLIENT_TYPE,
				EGL_CONTEXT_CLIENT_VERSION,
				EGL_RENDER_BUFFER
			};

			const EGLint	attribute = attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLint			value;
			EGLBoolean		result;

			result = egl.queryContext(m_display, context, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQueryContext(" << m_display << ", " << context << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQueryContext()");

		}
		else
			DE_ASSERT(false);
	}
}